

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O1

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_increment_node_count
          (Impl *this,SPIRVModule *param_1,bool per_thread)

{
  Builder *this_00;
  Vector<std::unique_ptr<Instruction>_> *pVVar1;
  Vector<Id> *this_01;
  vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *this_02;
  uint uVar2;
  iterator iVar3;
  Block *pBVar4;
  Id IVar5;
  Id IVar6;
  Id IVar7;
  Function *pFVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> tVar11;
  char *name;
  undefined7 in_register_00000011;
  char cVar12;
  Block *pBVar13;
  ulong uVar14;
  Block *entry;
  Vector<Id> local_c8;
  undefined4 local_ac;
  Function *local_a8;
  Block *local_a0;
  Block *local_98;
  ulong local_90;
  Block *local_88;
  Id local_80;
  uint local_7c;
  Block *local_78;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_70;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_48;
  
  local_90 = (ulong)!per_thread;
  IVar5 = (&this->increment_thread_node_count_call_id)[local_90];
  if (IVar5 == 0) {
    this_00 = &this->builder;
    local_78 = (this->builder).buildPoint;
    local_a0 = (Block *)0x0;
    local_80 = spv::Builder::makeBoolType(this_00);
    IVar5 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar6 = spv::Builder::makeIntegerType(this_00,0x40,false);
    local_ac = (int)CONCAT71(in_register_00000011,per_thread);
    IVar7 = spv::Builder::makeVoidType(this_00);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0xc);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 3;
    *local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = IVar6;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[1] = IVar5;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[2] = IVar5;
    name = "IncrementGroupNodeCount";
    cVar12 = (char)local_ac;
    if (cVar12 != '\0') {
      name = "IncrementThreadNodeCount";
    }
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pFVar8 = spv::Builder::makeFunctionEntry
                       (this_00,DecorationMax,IVar7,name,&local_c8,&local_48,&local_a0);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_48);
    if (local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
      free_in_thread(local_c8.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    spv::Builder::addName
              (this_00,(*(pFVar8->parameterInstructions).
                         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)->resultId,"AtomicCountersBDA");
    spv::Builder::addName
              (this_00,(pFVar8->parameterInstructions).
                       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]->resultId,"NodeMetadataIndex");
    spv::Builder::addName
              (this_00,(pFVar8->parameterInstructions).
                       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[2]->resultId,"Count");
    local_7c = (pFVar8->parameterInstructions).
               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start[2]->resultId;
    local_a8 = pFVar8;
    if (cVar12 == '\0') {
      local_98 = (Block *)allocate_in_thread(0x78);
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      local_98->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
      pVVar1 = &local_98->instructions;
      (local_98->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_98->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_98->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_98->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_98->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_98->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_98->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_98->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_98->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_98->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_98->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_98->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98->parent = pFVar8;
      local_98->unreachable = false;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = &PTR__Instruction_001f81e0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[2] = IVar6;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[4] = 0xf8;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[6] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[7] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[8] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[9] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[10] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xb] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xc] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xd] = 0;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)pVVar1,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_c8);
      if (local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_c8.
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))();
      }
      pFVar8 = local_a8;
      ((local_98->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_98;
      spv::Module::mapInstruction
                (local_a8->parent,
                 (local_98->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      local_88 = (Block *)allocate_in_thread(0x78);
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      local_88->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
      pVVar1 = &local_88->instructions;
      (local_88->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_88->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_88->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_88->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_88->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_88->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_88->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_88->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_88->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_88->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_88->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_88->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88->parent = pFVar8;
      local_88->unreachable = false;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = &PTR__Instruction_001f81e0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[2] = IVar6;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[4] = 0xf8;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[6] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[7] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[8] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[9] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[10] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xb] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xc] = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xd] = 0;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)pVVar1,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_c8);
      if (local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
        (**(code **)(*(long *)local_c8.
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))();
      }
      ((local_88->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_88;
      spv::Module::mapInstruction
                (local_a8->parent,
                 (local_88->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    }
    else {
      local_88 = (Block *)0x0;
      local_98 = (Block *)0x0;
    }
    IVar6 = spv::Builder::makeRuntimeArray(this_00,IVar5);
    spv::Builder::addDecoration(this_00,IVar6,DecorationArrayStride,4);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0xc);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 3;
    *local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = IVar5;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[1] = IVar5;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[2] = IVar6;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    IVar6 = spv::Builder::makeStructType(this_00,&local_c8,"NodeAtomicsEmpty");
    if (local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
      free_in_thread(local_c8.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    spv::Builder::addDecoration(this_00,IVar6,DecorationBlock,-1);
    spv::Builder::addMemberName(this_00,IVar6,0,"payloadCount");
    spv::Builder::addMemberName(this_00,IVar6,1,"fusedCount");
    spv::Builder::addMemberName(this_00,IVar6,2,"perNodeTotal");
    spv::Builder::addMemberDecoration(this_00,IVar6,0,DecorationOffset,0);
    spv::Builder::addMemberDecoration(this_00,IVar6,1,DecorationOffset,4);
    spv::Builder::addMemberDecoration(this_00,IVar6,2,DecorationOffset,8);
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    IVar6 = spv::Builder::makePointer(this_00,StorageClassPhysicalStorageBuffer,IVar6);
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    pIVar9->resultId = IVar7;
    pIVar9->typeId = IVar6;
    pIVar9->opCode = OpBitcast;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar9->block = (Block *)0x0;
    uVar2 = (*(local_a8->parameterInstructions).
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->resultId;
    iVar3._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = uVar2;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,iVar3,(uint *)&local_c8);
    }
    else {
      *iVar3._M_current = uVar2;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = uVar2;
    }
    IVar7 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar7;
    IVar6 = spv::Builder::makePointer(this_00,StorageClassPhysicalStorageBuffer,IVar5);
    pIVar10 = (Instruction *)allocate_in_thread(0x38);
    pIVar10->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    pIVar10->resultId = IVar7;
    pIVar10->typeId = IVar6;
    pIVar10->opCode = OpInBoundsAccessChain;
    this_01 = &pIVar10->operands;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar10->block = (Block *)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
    iVar3._M_current =
         (pIVar10->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pIVar10->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_01,iVar3,
                 (uint *)&local_c8);
    }
    else {
      *iVar3._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    IVar6 = spv::Builder::makeIntegerType(this_00,0x20,false);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeIntConstant(this_00,IVar6,2,false);
    pFVar8 = local_a8;
    iVar3._M_current =
         (pIVar10->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pIVar10->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_01,iVar3,
                 (uint *)&local_c8);
    }
    else {
      *iVar3._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ =
         (pFVar8->parameterInstructions).
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_start[1]->resultId;
    iVar3._M_current =
         (pIVar10->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pIVar10->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_01,iVar3,
                 (uint *)&local_c8);
    }
    else {
      *iVar3._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    IVar6 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar6;
    tVar11.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         allocate_in_thread(0x38);
    *(undefined ***)
     tVar11.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f81e0;
    *(Id *)((long)tVar11.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar6;
    *(Id *)((long)tVar11.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = IVar5;
    *(undefined4 *)
     ((long)tVar11.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = 0xea;
    this_02 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
              ((long)tVar11.
                     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                     .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18);
    *(long *)((long)tVar11.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
    *(long *)((long)tVar11.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
    *(long *)((long)tVar11.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
    *(long *)((long)tVar11.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = pIVar10->resultId;
    iVar3._M_current =
         *(uint **)((long)tVar11.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar3._M_current ==
        *(uint **)((long)tVar11.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(this_02,iVar3,(uint *)&local_c8);
    }
    else {
      *iVar3._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      *(uint **)((long)tVar11.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar3._M_current + 1;
    }
    IVar6 = spv::Builder::makeIntegerType(this_00,0x20,false);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeIntConstant(this_00,IVar6,1,false);
    iVar3._M_current =
         *(uint **)((long)tVar11.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar3._M_current ==
        *(uint **)((long)tVar11.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(this_02,iVar3,(uint *)&local_c8);
    }
    else {
      *iVar3._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      *(uint **)((long)tVar11.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar3._M_current + 1;
    }
    IVar6 = spv::Builder::makeIntegerType(this_00,0x20,false);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeIntConstant(this_00,IVar6,0,false);
    iVar3._M_current =
         *(uint **)((long)tVar11.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar3._M_current ==
        *(uint **)((long)tVar11.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(this_02,iVar3,(uint *)&local_c8);
    }
    else {
      *iVar3._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      *(uint **)((long)tVar11.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar3._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_c8.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,local_7c);
    iVar3._M_current =
         *(uint **)((long)tVar11.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar3._M_current ==
        *(uint **)((long)tVar11.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(this_02,iVar3,(uint *)&local_c8);
    }
    else {
      *iVar3._M_current = local_7c;
      *(uint **)((long)tVar11.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar3._M_current + 1;
    }
    pBVar13 = local_98;
    if ((char)local_ac != '\0') {
      pBVar13 = local_a0;
    }
    local_50._M_head_impl = pIVar9;
    add_instruction(this,pBVar13,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_50);
    if (local_50._M_head_impl != (Instruction *)0x0) {
      (*(local_50._M_head_impl)->_vptr_Instruction[1])();
    }
    local_50._M_head_impl = (Instruction *)0x0;
    local_58._M_head_impl = pIVar10;
    add_instruction(this,pBVar13,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_58);
    if (local_58._M_head_impl != (Instruction *)0x0) {
      (*(local_58._M_head_impl)->_vptr_Instruction[1])();
    }
    local_58._M_head_impl = (Instruction *)0x0;
    local_60._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         tVar11.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    add_instruction(this,pBVar13,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_60);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_60._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_60._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    uVar14 = local_90 * 4 + 0xdd4;
    local_60._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
    pBVar13 = local_a0;
    if ((char)local_ac == '\0') {
      IVar6 = get_builtin_shader_input(this,BuiltInLocalInvocationIndex);
      IVar7 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar7;
      pIVar9 = (Instruction *)allocate_in_thread(0x38);
      pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
      pIVar9->resultId = IVar7;
      pIVar9->typeId = IVar5;
      pIVar9->opCode = OpLoad;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar9->block = (Block *)0x0;
      iVar3._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_90 = uVar14;
      if (iVar3._M_current ==
          (pIVar9->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = IVar6;
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar9->operands,iVar3,(uint *)&local_c8);
      }
      else {
        *iVar3._M_current = IVar6;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = IVar6;
      }
      IVar5 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar5;
      tVar11.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           allocate_in_thread(0x38);
      *(undefined ***)
       tVar11.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f81e0;
      *(Id *)((long)tVar11.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar5;
      *(Id *)((long)tVar11.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = local_80
      ;
      *(undefined4 *)
       ((long)tVar11.
              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
              super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = 0xaa;
      *(long *)((long)tVar11.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
      *(long *)((long)tVar11.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
      *(long *)((long)tVar11.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
      *(long *)((long)tVar11.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
      iVar3._M_current =
           *(uint **)((long)tVar11.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      if (iVar3._M_current ==
          *(uint **)((long)tVar11.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   ((long)tVar11.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),
                   iVar3,(uint *)&local_c8);
      }
      else {
        *iVar3._M_current =
             (uint)local_c8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        *(uint **)((long)tVar11.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar3._M_current + 1;
      }
      IVar5 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar5 = spv::Builder::makeIntConstant(this_00,IVar5,0,false);
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_c8.
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar5);
      iVar3._M_current =
           *(uint **)((long)tVar11.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      if (iVar3._M_current ==
          *(uint **)((long)tVar11.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   ((long)tVar11.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),
                   iVar3,(uint *)&local_c8);
      }
      else {
        *iVar3._M_current = IVar5;
        *(uint **)((long)tVar11.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar3._M_current + 1;
      }
      IVar5 = *(Id *)((long)tVar11.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
      local_68._M_head_impl = pIVar9;
      add_instruction(this,local_a0,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_68);
      if (local_68._M_head_impl != (Instruction *)0x0) {
        (*(local_68._M_head_impl)->_vptr_Instruction[1])();
      }
      local_68._M_head_impl = (Instruction *)0x0;
      local_70._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           tVar11.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
      add_instruction(this,local_a0,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_70);
      pBVar13 = local_88;
      if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
          local_70._M_t.
          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
          super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
        (**(code **)(*(long *)local_70._M_t.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))()
        ;
      }
      local_70._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
      (this->builder).buildPoint = local_a0;
      spv::Builder::createSelectionMerge(this_00,pBVar13,0);
      pBVar4 = local_98;
      spv::Builder::createConditionalBranch(this_00,IVar5,local_98,pBVar13);
      (this->builder).buildPoint = pBVar4;
      spv::Builder::createBranch(this_00,pBVar13);
      uVar14 = local_90;
    }
    pFVar8 = local_a8;
    (this->builder).buildPoint = pBVar13;
    spv::Builder::makeReturn(this_00,false,0);
    (this->builder).buildPoint = local_78;
    *(Id *)((long)&(this->super_BlockEmissionInterface)._vptr_BlockEmissionInterface + uVar14) =
         (pFVar8->functionInstruction).resultId;
    IVar5 = (pFVar8->functionInstruction).resultId;
  }
  return IVar5;
}

Assistant:

spv::Id SPIRVModule::Impl::build_increment_node_count(SPIRVModule &, bool per_thread)
{
	auto &call_id = per_thread ? increment_thread_node_count_call_id : increment_group_node_count_call_id;
	if (call_id)
		return call_id;
	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uint64_type = builder.makeUintType(64);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(),
	                                       per_thread ? "IncrementThreadNodeCount" : "IncrementGroupNodeCount",
	                                       { uint64_type, uint_type, uint_type },
	                                       {}, &entry);

	builder.addName(func->getParamId(0), "AtomicCountersBDA");
	builder.addName(func->getParamId(1), "NodeMetadataIndex");
	builder.addName(func->getParamId(2), "Count");

	spv::Id total_count_id = func->getParamId(2);

	spv::Block *body_block = nullptr;
	spv::Block *merge_block = nullptr;

	if (!per_thread)
	{
		body_block = new spv::Block(builder.getUniqueId(), *func);
		merge_block = new spv::Block(builder.getUniqueId(), *func);
	}

	spv::Id uint_array_type = builder.makeRuntimeArray(uint_type);
	builder.addDecoration(uint_array_type, spv::DecorationArrayStride, 4);
	spv::Id struct_type_id = builder.makeStructType({ uint_type, uint_type, uint_array_type }, "NodeAtomicsEmpty");
	builder.addDecoration(struct_type_id, spv::DecorationBlock);
	builder.addMemberName(struct_type_id, 0, "payloadCount");
	builder.addMemberName(struct_type_id, 1, "fusedCount");
	builder.addMemberName(struct_type_id, 2, "perNodeTotal");
	builder.addMemberDecoration(struct_type_id, 0, spv::DecorationOffset, 0);
	builder.addMemberDecoration(struct_type_id, 1, spv::DecorationOffset, 4);
	builder.addMemberDecoration(struct_type_id, 2, spv::DecorationOffset, 8);

	auto cast_op = std::make_unique<spv::Instruction>(
	    builder.getUniqueId(),
	    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, struct_type_id),
	    spv::OpBitcast);
	cast_op->addIdOperand(func->getParamId(0));

	auto chain_index_op = std::make_unique<spv::Instruction>(
	    builder.getUniqueId(),
	    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
	    spv::OpInBoundsAccessChain);
	chain_index_op->addIdOperand(cast_op->getResultId());
	chain_index_op->addIdOperand(builder.makeUintConstant(2));
	chain_index_op->addIdOperand(func->getParamId(1));

	auto atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
	atomic_op->addIdOperand(chain_index_op->getResultId());
	atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
	atomic_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.
	atomic_op->addIdOperand(total_count_id);

	auto *body = per_thread ? entry : body_block;
	add_instruction(body, std::move(cast_op));
	add_instruction(body, std::move(chain_index_op));
	add_instruction(body, std::move(atomic_op));

	if (!per_thread)
	{
		spv::Id local_invocation_index = get_builtin_shader_input(spv::BuiltInLocalInvocationIndex);
		auto load_local_index = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
		load_local_index->addIdOperand(local_invocation_index);

		auto is_first_lane = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpIEqual);
		is_first_lane->addIdOperand(load_local_index->getResultId());
		is_first_lane->addIdOperand(builder.makeUintConstant(0));
		spv::Id is_first_lane_id = is_first_lane->getResultId();
		add_instruction(entry, std::move(load_local_index));
		add_instruction(entry, std::move(is_first_lane));

		builder.setBuildPoint(entry);
		builder.createSelectionMerge(merge_block, 0);
		builder.createConditionalBranch(is_first_lane_id, body_block, merge_block);

		builder.setBuildPoint(body_block);
		builder.createBranch(merge_block);
		builder.setBuildPoint(merge_block);
		builder.makeReturn(false);
	}
	else
	{
		builder.setBuildPoint(entry);
		builder.makeReturn(false);
	}

	builder.setBuildPoint(current_build_point);
	call_id = func->getId();
	return func->getId();
}